

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O3

void __thiscall
cxxopts::values::standard_value<bool>::standard_value(standard_value<bool> *this,bool *b)

{
  (this->super_abstract_value<bool>).super_Value.super_enable_shared_from_this<cxxopts::Value>.
  _M_weak_this.super___weak_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_abstract_value<bool>).super_Value.super_enable_shared_from_this<cxxopts::Value>.
  _M_weak_this.super___weak_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_abstract_value<bool>).m_result.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->super_abstract_value<bool>).m_result.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_abstract_value<bool>).m_store = b;
  (this->super_abstract_value<bool>).m_default = false;
  (this->super_abstract_value<bool>).m_implicit = false;
  (this->super_abstract_value<bool>).m_default_value._M_dataplus._M_p =
       (pointer)&(this->super_abstract_value<bool>).m_default_value.field_2;
  (this->super_abstract_value<bool>).m_default_value._M_string_length = 0;
  (this->super_abstract_value<bool>).m_default_value.field_2._M_local_buf[0] = '\0';
  (this->super_abstract_value<bool>).m_implicit_value._M_dataplus._M_p =
       (pointer)&(this->super_abstract_value<bool>).m_implicit_value.field_2;
  (this->super_abstract_value<bool>).m_implicit_value._M_string_length = 0;
  (this->super_abstract_value<bool>).m_implicit_value.field_2._M_local_buf[0] = '\0';
  (this->super_abstract_value<bool>).super_Value._vptr_Value =
       (_func_int **)&PTR__abstract_value_00159048;
  set_default_and_implicit(this);
  return;
}

Assistant:

explicit standard_value(bool* b)
      : abstract_value(b)
      {
        set_default_and_implicit();
      }